

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O0

void interlace_row(png_bytep buffer,png_const_bytep imageRow,uint pixel_size,png_uint_32 w,int pass,
                  int littleendian)

{
  undefined1 local_38;
  undefined4 local_30;
  png_uint_32 xstep;
  png_uint_32 xout;
  png_uint_32 xin;
  int littleendian_local;
  int pass_local;
  png_uint_32 w_local;
  uint pixel_size_local;
  png_const_bytep imageRow_local;
  png_bytep buffer_local;
  
  xstep = (pass & 1U) << (3U - (char)(pass + 1 >> 1) & 0x1f) & 7;
  if (pass < 2) {
    local_38 = 3;
  }
  else {
    local_38 = (byte)(7 - pass >> 1);
  }
  local_30 = 0;
  for (; xstep < w; xstep = (1 << (local_38 & 0x1f)) + xstep) {
    pixel_copy(buffer,local_30,imageRow,xstep,pixel_size,littleendian);
    local_30 = local_30 + 1;
  }
  return;
}

Assistant:

static void
interlace_row(png_bytep buffer, png_const_bytep imageRow,
   unsigned int pixel_size, png_uint_32 w, int pass, int littleendian)
{
   png_uint_32 xin, xout, xstep;

   /* Note that this can, trivially, be optimized to a memcpy on pass 7, the
    * code is presented this way to make it easier to understand.  In practice
    * consult the code in the libpng source to see other ways of doing this.
    *
    * It is OK for buffer and imageRow to be identical, because 'xin' moves
    * faster than 'xout' and we copy up.
    */
   xin = PNG_PASS_START_COL(pass);
   xstep = 1U<<PNG_PASS_COL_SHIFT(pass);

   for (xout=0; xin<w; xin+=xstep)
   {
      pixel_copy(buffer, xout, imageRow, xin, pixel_size, littleendian);
      ++xout;
   }
}